

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexHullShape.cpp
# Opt level: O3

void __thiscall
cbtConvexHullShape::cbtConvexHullShape
          (cbtConvexHullShape *this,cbtScalar *points,int numPoints,int stride)

{
  cbtScalar *pcVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  cbtScalar cVar4;
  cbtVector3 *ptr;
  undefined8 uVar5;
  cbtVector3 *pcVar6;
  long lVar7;
  long lVar8;
  cbtScalar *pcVar9;
  
  cbtPolyhedralConvexAabbCachingShape::cbtPolyhedralConvexAabbCachingShape
            (&this->super_cbtPolyhedralConvexAabbCachingShape);
  (this->super_cbtPolyhedralConvexAabbCachingShape).super_cbtPolyhedralConvexShape.
  super_cbtConvexInternalShape.super_cbtConvexShape.super_cbtCollisionShape._vptr_cbtCollisionShape
       = (_func_int **)&PTR__cbtConvexHullShape_00b4a088;
  (this->m_unscaledPoints).m_ownsMemory = true;
  (this->m_unscaledPoints).m_data = (cbtVector3 *)0x0;
  (this->m_unscaledPoints).m_size = 0;
  (this->m_unscaledPoints).m_capacity = 0;
  (this->super_cbtPolyhedralConvexAabbCachingShape).super_cbtPolyhedralConvexShape.
  super_cbtConvexInternalShape.super_cbtConvexShape.super_cbtCollisionShape.m_shapeType = 4;
  if (numPoints < 1) {
    (this->m_unscaledPoints).m_size = numPoints;
  }
  else {
    pcVar6 = (cbtVector3 *)cbtAlignedAllocInternal((ulong)(uint)numPoints << 4,0x10);
    lVar7 = (long)(this->m_unscaledPoints).m_size;
    if (0 < lVar7) {
      lVar8 = 0;
      do {
        puVar2 = (undefined8 *)((long)((this->m_unscaledPoints).m_data)->m_floats + lVar8);
        uVar5 = puVar2[1];
        puVar3 = (undefined8 *)((long)pcVar6->m_floats + lVar8);
        *puVar3 = *puVar2;
        puVar3[1] = uVar5;
        lVar8 = lVar8 + 0x10;
      } while (lVar7 * 0x10 != lVar8);
    }
    ptr = (this->m_unscaledPoints).m_data;
    if ((ptr != (cbtVector3 *)0x0) && ((this->m_unscaledPoints).m_ownsMemory == true)) {
      cbtAlignedFreeInternal(ptr);
    }
    (this->m_unscaledPoints).m_ownsMemory = true;
    (this->m_unscaledPoints).m_data = pcVar6;
    (this->m_unscaledPoints).m_capacity = numPoints;
    (this->m_unscaledPoints).m_size = numPoints;
    if (0 < numPoints) {
      pcVar9 = points + 2;
      lVar7 = 0;
      do {
        cVar4 = *pcVar9;
        pcVar1 = pcVar9 + -2;
        pcVar6 = (this->m_unscaledPoints).m_data;
        pcVar9 = (cbtScalar *)((long)pcVar9 + (long)stride);
        *(undefined8 *)((long)pcVar6->m_floats + lVar7) = *(undefined8 *)pcVar1;
        *(cbtScalar *)((long)pcVar6->m_floats + lVar7 + 8) = cVar4;
        *(undefined4 *)((long)pcVar6->m_floats + lVar7 + 0xc) = 0;
        lVar7 = lVar7 + 0x10;
      } while ((ulong)(uint)numPoints << 4 != lVar7);
    }
  }
  cbtPolyhedralConvexAabbCachingShape::recalcLocalAabb
            (&this->super_cbtPolyhedralConvexAabbCachingShape);
  return;
}

Assistant:

cbtConvexHullShape ::cbtConvexHullShape(const cbtScalar* points, int numPoints, int stride) : cbtPolyhedralConvexAabbCachingShape()
{
	m_shapeType = CONVEX_HULL_SHAPE_PROXYTYPE;
	m_unscaledPoints.resize(numPoints);

	unsigned char* pointsAddress = (unsigned char*)points;

	for (int i = 0; i < numPoints; i++)
	{
		cbtScalar* point = (cbtScalar*)pointsAddress;
		m_unscaledPoints[i] = cbtVector3(point[0], point[1], point[2]);
		pointsAddress += stride;
	}

	recalcLocalAabb();
}